

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

logical pnga_create_bin_range(Integer g_bin,Integer g_cnt,Integer g_off,Integer *g_range)

{
  logical lVar1;
  Integer p1;
  Integer stat;
  Integer bhi;
  Integer blo;
  Integer cnt;
  Integer off;
  Integer buf [2];
  char *in_stack_00000050;
  Integer hi;
  Integer lo;
  Integer bin;
  Integer *myoff;
  Integer last_off;
  Integer first_off;
  Integer p;
  Integer last_proc;
  Integer first_proc;
  Integer thi [2];
  Integer tlo [2];
  Integer chunk [2];
  Integer in_stack_000000d0;
  Integer nproc;
  Integer dims [2];
  Integer crap;
  Integer me;
  Integer hibin;
  Integer lobin;
  Integer nbin;
  Integer ndim;
  Integer type;
  Integer *in_stack_000001b8;
  Integer *in_stack_000001c0;
  Integer in_stack_000001c8;
  Integer in_stack_000001d0;
  Integer *in_stack_000001d8;
  Integer *in_stack_000001e0;
  Integer in_stack_000001e8;
  Integer *in_stack_00000290;
  void *in_stack_00000298;
  Integer *in_stack_000002a0;
  Integer *in_stack_000002a8;
  Integer in_stack_000002b0;
  Integer *in_stack_fffffffffffffeb0;
  Integer *in_stack_fffffffffffffeb8;
  Integer *in_stack_fffffffffffffec0;
  Integer *in_stack_fffffffffffffec8;
  Integer *in_stack_fffffffffffffed0;
  ulong in_stack_fffffffffffffed8;
  Integer in_stack_fffffffffffffee0;
  long local_118;
  long local_110;
  Integer local_100;
  Integer local_f8;
  long local_f0;
  long *local_e8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_50;
  long local_48;
  long local_38;
  long local_30;
  logical local_8;
  
  pnga_nodeid();
  pnga_nnodes();
  pnga_inquire(in_stack_000000d0,(Integer *)chunk[1],(Integer *)chunk[0],(Integer *)tlo[1]);
  if (local_38 != 1) {
    pnga_error(in_stack_00000050,buf[1]);
  }
  if (((local_30 != 0x3e9) && (local_30 != 0x3ea)) && (local_30 != 0x3f8)) {
    pnga_error(in_stack_00000050,buf[1]);
  }
  lVar1 = pnga_create(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                      (char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffeb8);
  if (lVar1 == 0) {
    local_8 = 0;
  }
  else {
    pnga_distribution(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
    if (0 < local_48) {
      pnga_access_ptr(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
                      in_stack_00000290);
      lVar1 = pnga_locate(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
      if (lVar1 == 0) {
        pnga_error(in_stack_00000050,buf[1]);
      }
      lVar1 = pnga_locate(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
      if (lVar1 == 0) {
        pnga_error(in_stack_00000050,buf[1]);
      }
      local_f0 = local_48;
      for (local_d0 = local_c0; local_d0 <= local_c8; local_d0 = local_d0 + 1) {
        local_118 = -1;
        local_110 = -1;
        pnga_distribution(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
        for (; local_f0 <= local_50; local_f0 = local_f0 + 1) {
          in_stack_fffffffffffffed0 = (Integer *)(*local_e8 + 1);
          if (local_f0 == local_50) {
            pnga_get(first_off,(Integer *)last_off,myoff,(void *)bin,(Integer *)lo);
            in_stack_fffffffffffffec8 =
                 (Integer *)((long)in_stack_fffffffffffffed0 + (in_stack_fffffffffffffed8 - 1));
          }
          else {
            in_stack_fffffffffffffec8 = (Integer *)local_e8[1];
          }
          in_stack_fffffffffffffeb0 =
               (Integer *)
               sgai_match_bin2proc((Integer)in_stack_fffffffffffffed0,
                                   (Integer)in_stack_fffffffffffffec8,local_f8,local_100);
          switch(in_stack_fffffffffffffeb0) {
          case (Integer *)0x0:
            break;
          case (Integer *)0x1:
            local_118 = local_f0;
            break;
          case (Integer *)0x2:
            local_110 = local_f0;
            break;
          case (Integer *)0x3:
            local_118 = local_f0;
            local_110 = local_f0;
          }
          in_stack_fffffffffffffec0 = in_stack_fffffffffffffeb0;
          if (1 < (long)in_stack_fffffffffffffeb0) break;
          local_e8 = local_e8 + 1;
        }
        in_stack_fffffffffffffed8 = (ulong)(local_118 != -1);
        if (local_110 != -1) {
          in_stack_fffffffffffffed8 = in_stack_fffffffffffffed8 + 1;
        }
        if (in_stack_fffffffffffffed8 != 0) {
          local_f8 = (ulong)(local_118 == -1) + 1;
          local_100 = local_f8 + in_stack_fffffffffffffed8 + -1;
          pnga_put((Integer)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   in_stack_fffffffffffffec0,(void *)(local_d0 + 1),in_stack_fffffffffffffeb0);
        }
      }
    }
    local_8 = 1;
  }
  return local_8;
}

Assistant:

logical pnga_create_bin_range(Integer g_bin, Integer g_cnt, Integer g_off, Integer *g_range)
{
Integer type, ndim, nbin, lobin, hibin, me=pnga_nodeid(),crap;
Integer dims[2], nproc=pnga_nnodes(),chunk[2];
Integer tlo[2], thi[2];

    pnga_inquire(g_bin, &type, &ndim, &nbin);
    if(ndim !=1) pnga_error("ga_bin_index: 1-dim array required",ndim);
    if(type!= C_INT && type!=C_LONG && type!=C_LONGLONG)
       pnga_error("ga_bin_index: not integer type",type);

    chunk[0]=dims[0]=2; dims[1]=nproc; chunk[1]=1;
    if(!pnga_create(MT_F_INT, 2, dims, "bin_proc",chunk,g_range)) return FALSE;

    pnga_distribution(g_off,me, &lobin,&hibin);

    if(lobin>0){ /* enter this block when we have data */
      Integer first_proc, last_proc, p;
      Integer first_off, last_off;
      Integer *myoff, bin;

      /* get offset values stored on my processor to first and last bin */
      pnga_access_ptr(g_off, &lobin, &hibin, &myoff, &crap);
      first_off = myoff[0]; last_off = myoff[hibin-lobin];
/*
      pnga_get(g_off,&lobin,&lobin,&first_off,&lo);
      pnga_get(g_off,&hibin,&hibin,&last_off,&hi);
*/

      /* since offset starts at 0, add 1 to get index to g_bin */
      first_off++; last_off++;

      /* find processors on which these bins are located */
      if(!pnga_locate(g_bin, &first_off, &first_proc))
          pnga_error("ga_bin_sorter: failed to locate region f",first_off);
      if(!pnga_locate(g_bin, &last_off, &last_proc))
          pnga_error("ga_bin_sorter: failed to locate region l",last_off);

      /* inspect range of indices to bin elements stored on these processors */
      for(p=first_proc, bin=lobin; p<= last_proc; p++){
          Integer lo, hi, buf[2], off, cnt; 
          buf[0] =-1; buf[1]=-1;

          pnga_distribution(g_bin,p,&lo,&hi);

          for(/* start from current bin */; bin<= hibin; bin++, myoff++){ 
              Integer blo,bhi,stat;

              blo = *myoff +1;
              if(bin == hibin){
                 pnga_get(g_cnt, &hibin, &hibin, &cnt, &hibin); /* local */
                 bhi = blo + cnt-1; 
              }else
                 bhi = myoff[1]; 

              stat= sgai_match_bin2proc(blo, bhi, lo, hi);

              switch (stat) {
              case 0:  /* bin in a middle */ break;
              case 1:  /* first bin on that processor */
                       buf[0] =bin; break;
              case 2:  /* last bin on that processor */
                       buf[1] =bin; break;
              case 3:  /* first and last bin on that processor */
                       buf[0] =bin; buf[1] =bin; break;
              }

              if(stat>1)break; /* found last bin on that processor */
          }
          
          /* set range of bins on processor p */
          cnt =0; off=1;
          if(buf[0]!=-1){cnt=1; off=0;} 
          if(buf[1]!=-1)cnt++; 
          if(cnt){
                 Integer p1 = p+1;
                 lo = 1+off; hi = lo+cnt-1;
                 tlo[0] = lo;
                 tlo[1] = p1;
                 thi[0] = hi;
                 thi[1] = p1;
                 pnga_put(*g_range, tlo, thi, buf+off, &cnt);
          }
      }
   }
   return TRUE;
}